

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O1

int OPENSSL_gmtime_adj(tm *tm,int offset_day,int64_t offset_sec)

{
  int iVar1;
  int64_t posix_time;
  long local_20;
  
  iVar1 = OPENSSL_tm_to_posix(tm,&local_20);
  if (iVar1 != 0) {
    local_20 = (long)offset_day * 0x15180 + local_20;
    if ((local_20 < 1 || offset_sec <= -local_20 + 0x7fffffffffffffff) &&
       ((-1 < local_20 || (-local_20 + -0x8000000000000000 <= offset_sec)))) {
      local_20 = local_20 + offset_sec;
      iVar1 = OPENSSL_posix_to_tm(local_20,tm);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int OPENSSL_gmtime_adj(struct tm *tm, int offset_day, int64_t offset_sec) {
  int64_t posix_time;
  if (!OPENSSL_tm_to_posix(tm, &posix_time)) {
    return 0;
  }
  static_assert(INT_MAX <= INT64_MAX / SECS_PER_DAY,
                "day offset in seconds cannot overflow");
  static_assert(MAX_POSIX_TIME <= INT64_MAX - INT_MAX * SECS_PER_DAY,
                "addition cannot overflow");
  static_assert(MIN_POSIX_TIME >= INT64_MIN - INT_MIN * SECS_PER_DAY,
                "addition cannot underflow");
  posix_time += offset_day * SECS_PER_DAY;
  if (posix_time > 0 && offset_sec > INT64_MAX - posix_time) {
    return 0;
  }
  if (posix_time < 0 && offset_sec < INT64_MIN - posix_time) {
    return 0;
  }
  posix_time += offset_sec;

  if (!OPENSSL_posix_to_tm(posix_time, tm)) {
    return 0;
  }

  return 1;
}